

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes_abi_cxx11_
          (string *__return_storage_ptr__,XmlUnitTestResultPrinter *this,TestResult *result)

{
  ostream *poVar1;
  string *psVar2;
  stringstream *psVar3;
  TestProperty *pTVar4;
  size_t sVar5;
  char *__s;
  int i;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_88;
  string local_68;
  string *local_48;
  stringstream *local_40;
  allocator local_31;
  
  local_48 = __return_storage_ptr__;
  Message::Message((Message *)&local_90);
  local_40 = local_90.ptr_;
  if (0 < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                       (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                             _vptr_TestEventListener) >> 6)) {
    poVar1 = (ostream *)(local_90.ptr_ + 0x10);
    i = 0;
    do {
      pTVar4 = TestResult::GetTestProperty((TestResult *)this,i);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      __s = (pTVar4->key_)._M_dataplus._M_p;
      if (__s == (char *)0x0) {
        sVar5 = 6;
        __s = "(null)";
      }
      else {
        sVar5 = strlen(__s);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      std::__cxx11::string::string((string *)&local_88,(pTVar4->value_)._M_dataplus._M_p,&local_31);
      EscapeXml(&local_68,&local_88,true);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)this[2].output_file_._M_dataplus._M_p -
                              (long)this[2].super_EmptyTestEventListener.super_TestEventListener.
                                    _vptr_TestEventListener) >> 6));
  }
  psVar3 = local_40;
  psVar2 = local_48;
  StringStreamToString(local_48,local_40);
  if (psVar3 != (stringstream *)0x0) {
    (**(code **)(*(long *)psVar3 + 8))(psVar3);
  }
  return psVar2;
}

Assistant:

std::string XmlUnitTestResultPrinter::TestPropertiesAsXmlAttributes(
    const TestResult& result) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << " " << property.key() << "="
        << "\"" << EscapeXmlAttribute(property.value()) << "\"";
  }
  return attributes.GetString();
}